

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O0

void __thiscall QFileInfo::QFileInfo(QFileInfo *this,QFileDevice *file)

{
  long *in_RSI;
  QSharedDataPointer<QFileInfoPrivate> *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_00000008;
  QFileInfoPrivate *in_stack_00000010;
  QFileInfoPrivate *in_stack_ffffffffffffffa8;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  operator_new(0x1e8);
  (**(code **)(*in_RSI + 0xe8))(local_20);
  QFileInfoPrivate::QFileInfoPrivate(in_stack_00000010,in_stack_00000008);
  QSharedDataPointer<QFileInfoPrivate>::QSharedDataPointer(in_RDI,in_stack_ffffffffffffffa8);
  QString::~QString((QString *)0x2aabf5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFileInfo::QFileInfo(const QFileDevice &file) : d_ptr(new QFileInfoPrivate(file.fileName()))
{
}